

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_7::writeTileData
               (Data *ofd,int dx,int dy,int lx,int ly,char *pixelData,Int64 pixelDataSize,
               Int64 unpackedDataSize,char *sampleCountTableData,Int64 sampleCountTableSize)

{
  long *plVar1;
  int iVar2;
  TileOffsets *this;
  Int64 *pIVar3;
  long in_RDI;
  undefined8 in_R9;
  ulong in_stack_00000008;
  undefined8 in_stack_00000018;
  Int64 currentPosition;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  OStream *in_stack_ffffffffffffffc0;
  TileOffsets *pTVar4;
  undefined8 in_stack_ffffffffffffffc8;
  long lVar5;
  
  this = *(TileOffsets **)(*(long *)(in_RDI + 0x1c0) + 0x30);
  *(undefined8 *)(*(long *)(in_RDI + 0x1c0) + 0x30) = 0;
  if (this == (TileOffsets *)0x0) {
    this = (TileOffsets *)(**(code **)(**(long **)(*(long *)(in_RDI + 0x1c0) + 0x28) + 0x18))();
  }
  pTVar4 = this;
  pIVar3 = TileOffsets::operator()
                     (this,(int)((ulong)this >> 0x20),(int)this,
                      (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8
                     );
  *pIVar3 = (Int64)this;
  if ((*(byte *)(in_RDI + 0x3c) & 1) != 0) {
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
            (in_stack_ffffffffffffffc0,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
            );
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
            (in_stack_ffffffffffffffc0,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
            );
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
            (in_stack_ffffffffffffffc0,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
            );
  plVar1 = *(long **)(*(long *)(in_RDI + 0x1c0) + 0x28);
  (**(code **)(*plVar1 + 0x10))(plVar1,in_stack_00000018,currentPosition & 0xffffffff);
  plVar1 = *(long **)(*(long *)(in_RDI + 0x1c0) + 0x28);
  (**(code **)(*plVar1 + 0x10))(plVar1,in_R9,in_stack_00000008 & 0xffffffff);
  iVar2 = Xdr::size<int>();
  lVar5 = (long)&pTVar4->_mode + (long)(iVar2 << 2);
  iVar2 = Xdr::size<unsigned_long>();
  *(Int64 *)(*(long *)(in_RDI + 0x1c0) + 0x30) =
       lVar5 + iVar2 * 3 + currentPosition + in_stack_00000008;
  if ((*(byte *)(in_RDI + 0x3c) & 1) != 0) {
    iVar2 = Xdr::size<int>();
    *(long *)(*(long *)(in_RDI + 0x1c0) + 0x30) =
         (long)iVar2 + *(long *)(*(long *)(in_RDI + 0x1c0) + 0x30);
  }
  return;
}

Assistant:

void
writeTileData (DeepTiledOutputFile::Data *ofd,
               int dx, int dy,
               int lx, int ly,
               const char pixelData[],
               Int64 pixelDataSize,
               Int64 unpackedDataSize,
               const char sampleCountTableData[],
               Int64 sampleCountTableSize)
{
    
    //
    // Store a block of pixel data in the output file, and try
    // to keep track of the current writing position the file,
    // without calling tellp() (tellp() can be fairly expensive).
    //

    Int64 currentPosition = ofd->_streamData->currentPosition;
    ofd->_streamData->currentPosition = 0;

    if (currentPosition == 0)
        currentPosition = ofd->_streamData->os->tellp();

    ofd->tileOffsets (dx, dy, lx, ly) = currentPosition;

    #ifdef DEBUG
        assert (ofd->_streamData->os->tellp() == currentPosition);
    #endif

    //
    // Write the tile header.
    //

    if (ofd->multipart)
    {
        Xdr::write <StreamIO> (*ofd->_streamData->os, ofd->partNumber);
    }
    Xdr::write <StreamIO> (*ofd->_streamData->os, dx);
    Xdr::write <StreamIO> (*ofd->_streamData->os, dy);
    Xdr::write <StreamIO> (*ofd->_streamData->os, lx);
    Xdr::write <StreamIO> (*ofd->_streamData->os, ly);

    //
    // Write the packed size of the pixel sample count table (64 bits)
    //

    Xdr::write <StreamIO> (*ofd->_streamData->os, sampleCountTableSize);

    //
    // Write the packed and unpacked data size (64 bits each)
    //

    Xdr::write <StreamIO> (*ofd->_streamData->os, pixelDataSize);
    Xdr::write <StreamIO> (*ofd->_streamData->os, unpackedDataSize);

    //
    // Write the compressed pixel sample count table.
    //

    ofd->_streamData->os->write (sampleCountTableData, sampleCountTableSize);

    //
    // Write the compressed data.
    //

    ofd->_streamData->os->write (pixelData, pixelDataSize);

    //
    // Keep current position in the file so that we can avoid
    // redundant seekg() operations (seekg() can be fairly expensive).
    //

    ofd->_streamData->currentPosition = currentPosition        +
                                  4 * Xdr::size<int>()   + // dx, dy, lx, ly,
                                  3 * Xdr::size<Int64>() + // sampleCountTableSize,
                                                           // pixelDataSize,
                                                           // unpackedDataSize
                                  sampleCountTableSize   +
                                  pixelDataSize;

    if (ofd->multipart)
    {
        ofd->_streamData->currentPosition += Xdr::size<int>();
    }
}